

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_format_playground.c
# Opt level: O1

int main(void)

{
  cesl_format_t *self;
  cesl_format_t *pcVar1;
  long lVar2;
  cesl_format_t my_format_g;
  cesl_format_t local_b0;
  
  cesl_dprintf("String format playground\n");
  self = cesl_format_create(&local_b0,0x400,my_format_buffer_g);
  cesl_dprintf("--- Simple style ---\n");
  cesl_format_s(&local_b0,"1");
  cesl_format_s(&local_b0,"2");
  cesl_format_s(&local_b0," Some int: ");
  cesl_format_i(&local_b0,0x22);
  cesl_format_s(&local_b0," After int");
  cesl_dprintf("Final: \'%s\'\n",local_b0.buf);
  cesl_dprintf("\n--- Stream style ---\n");
  pcVar1 = (*self->rst)(self);
  pcVar1 = (*pcVar1->s)(self,"1");
  pcVar1 = (*pcVar1->s)(self,"2");
  pcVar1 = (*pcVar1->s)(self," Some int: ");
  pcVar1 = (*pcVar1->i)(self,0x22);
  (*pcVar1->s)(self," After int");
  cesl_dprintf("Final: \'%s\'\n",self->buf);
  cesl_dprintf("\n--- Logging examples ---\n");
  cesl_dprintf("Max buffer size of %d reached\n",0x800);
  pcVar1 = dbg(self);
  pcVar1 = (*pcVar1->s)(self,"Max buffer size of ");
  pcVar1 = (*pcVar1->i)(self,0x800);
  pcVar1 = (*pcVar1->s)(self," reached\n");
  (*pcVar1->print)(self);
  cesl_dprintf("Error %d on line %d character %d in file %s\n",0xc,0x37,0x1e,"myfile.c");
  pcVar1 = dbg(self);
  pcVar1 = (*pcVar1->s)(self,"Error ");
  pcVar1 = (*pcVar1->i)(self,0xc);
  pcVar1 = (*pcVar1->s)(self," on line ");
  pcVar1 = (*pcVar1->i)(self,0x37);
  pcVar1 = (*pcVar1->s)(self," character ");
  pcVar1 = (*pcVar1->i)(self,0x1e);
  lVar2 = (long)(*pcVar1->s)(self," in file ");
  lVar2 = (**(code **)(lVar2 + 0x38))(self,"myfile.c\n");
  (**(code **)(lVar2 + 0x30))(self);
  cesl_dprintf("Negative number %d\n",0xffffffd3);
  pcVar1 = dbg(self);
  pcVar1 = (*pcVar1->s)(self,"Negative number ");
  pcVar1 = (*pcVar1->i)(self,-0x2d);
  pcVar1 = (*pcVar1->s)(self,"\n");
  (*pcVar1->print)(self);
  pcVar1 = dbg(self);
  pcVar1 = (*pcVar1->s)(self,"Numbers concatenate: ");
  pcVar1 = (*pcVar1->i)(self,0x21);
  pcVar1 = (*pcVar1->i)(self,0x2c);
  pcVar1 = (*pcVar1->i)(self,0x37);
  pcVar1 = (*pcVar1->i)(self,-99);
  (*pcVar1->print)(self);
  return 0;
}

Assistant:

int main()
{
    cesl_format_t my_format_g;
    cesl_dprintf("String format playground\n");
    cesl_format_t* f = cesl_format_create(&my_format_g, my_format_buf_max_size, my_format_buffer_g);
    cesl_dprintf("--- Simple style ---\n");
    cesl_format_s(&my_format_g, "1");
    cesl_format_s(&my_format_g, "2");
    cesl_format_s(&my_format_g, " Some int: ");
    cesl_format_i(&my_format_g, 34);
    cesl_format_s(&my_format_g, " After int");
    cesl_dprintf("Final: '%s'\n", my_format_g.buf);


    // Stream style
    cesl_dprintf("\n--- Stream style ---\n");

    f->rst(f)->s(f, "1")->s(f, "2")->s(f, " Some int: ")->i(f, 34)
            ->s(f, " After int");
    cesl_dprintf("Final: '%s'\n", f->buf);

    //
    cesl_dprintf("\n--- Logging examples ---\n");
    cesl_dprintf("Max buffer size of %d reached\n", 2048);
    dbg(f)->s(f, "Max buffer size of ")->i(f, 2048)->s(f, " reached\n")->print(f);
//    cout<< "Max buffer size of " << (f, 2048)->s(f, " reached\n")->dprint(f);

    cesl_dprintf("Error %d on line %d character %d in file %s\n", 12, 55, 30, "myfile.c");
    dbg(f)->s(f, "Error ")->i(f, 12)->s(f, " on line ")->i(f, 55)->s(f, " character ")
            ->i(f, 30)->s(f, " in file ")->s(f, "myfile.c\n")->print(f);


    cesl_dprintf("Negative number %d\n", -45);
    dbg(f)->s(f, "Negative number ")->i(f, -45)->s(f, "\n")->print(f);

//    f->rst(f)->s(f, "Error ")->i(f, 12)->s(f, " on line ")->i(f, 55)->s(f, " character ");
//    f->i(f, 30)->s(f, " in file ")->s(f, "myfile.c\n")->dprint(f)->log(f, LOG_LVL_2);
    dbg(f)->s(f, "Numbers concatenate: ")->i(f, 33)->i(f, 44)->i(f, 55)->i(f, -99)->print(f);


    return 0;
}